

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O2

JDIMENSION preload_image(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  int iVar1;
  FILE *__stream;
  jpeg_progress_mgr *pjVar2;
  jpeg_error_mgr *pjVar3;
  int iVar4;
  uint uVar5;
  JDIMENSION JVar6;
  JSAMPARRAY ppJVar7;
  size_t sVar8;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar9;
  
  __stream = (FILE *)sinfo->input_file;
  pjVar2 = cinfo->progress;
  uVar9 = 0;
  while( true ) {
    uVar5 = cinfo->image_height;
    if (uVar5 <= uVar9) break;
    if (pjVar2 != (jpeg_progress_mgr *)0x0) {
      pjVar2->pass_counter = uVar9;
      pjVar2->pass_limit = (ulong)uVar5;
      (*pjVar2->progress_monitor)((j_common_ptr)cinfo);
    }
    ppJVar7 = (*cinfo->mem->access_virt_sarray)
                        ((j_common_ptr)cinfo,(jvirt_sarray_ptr)sinfo[1].finish_input,
                         (JDIMENSION)uVar9,1,1);
    sVar8 = fread(*ppJVar7,1,(ulong)*(uint *)((long)&sinfo[1].input_file + 4),__stream);
    if (sVar8 != *(uint *)((long)&sinfo[1].input_file + 4)) {
      iVar4 = feof(__stream);
      pjVar3 = cinfo->err;
      iVar1 = 0x2b;
      if (iVar4 == 0) {
        iVar1 = 0x24;
      }
      pjVar3->msg_code = iVar1;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
    uVar9 = uVar9 + 1;
  }
  if (pjVar2 != (jpeg_progress_mgr *)0x0) {
    *(int *)&pjVar2[1].progress_monitor = *(int *)&pjVar2[1].progress_monitor + 1;
  }
  iVar1 = *(int *)&sinfo[1].buffer;
  if (iVar1 == 0x20) {
    UNRECOVERED_JUMPTABLE = get_32bit_row;
  }
  else if (iVar1 == 0x18) {
    UNRECOVERED_JUMPTABLE = get_24bit_row;
  }
  else {
    if (iVar1 != 8) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x3ea;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
      uVar5 = cinfo->image_height;
      UNRECOVERED_JUMPTABLE = sinfo->get_pixel_rows;
      goto LAB_00106732;
    }
    UNRECOVERED_JUMPTABLE = get_8bit_row;
  }
  sinfo->get_pixel_rows = UNRECOVERED_JUMPTABLE;
LAB_00106732:
  *(uint *)&sinfo[1].input_file = uVar5;
  JVar6 = (*UNRECOVERED_JUMPTABLE)(cinfo,sinfo);
  return JVar6;
}

Assistant:

METHODDEF(JDIMENSION)
preload_image(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  tga_source_ptr source = (tga_source_ptr)sinfo;
  JDIMENSION row;
  cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;

  /* Read the data into a virtual array in input-file row order. */
  for (row = 0; row < cinfo->image_height; row++) {
    if (progress != NULL) {
      progress->pub.pass_counter = (long)row;
      progress->pub.pass_limit = (long)cinfo->image_height;
      (*progress->pub.progress_monitor) ((j_common_ptr)cinfo);
    }
    source->pub.buffer = (*cinfo->mem->access_virt_sarray)
      ((j_common_ptr)cinfo, source->whole_image, row, (JDIMENSION)1, TRUE);
    (*source->get_pixel_rows) (cinfo, sinfo);
  }
  if (progress != NULL)
    progress->completed_extra_passes++;

  /* Set up to read from the virtual array in unscrambled order */
  source->pub.get_pixel_rows = get_memory_row;
  source->current_row = 0;
  /* And read the first row */
  return get_memory_row(cinfo, sinfo);
}